

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall gdsTEXT::reset(gdsTEXT *this)

{
  gdsTEXT *this_local;
  
  std::bitset<16UL>::reset(&this->presentation_flags);
  this->text_type = 0;
  this->path_type = 0;
  this->width = 0;
  std::bitset<16UL>::reset(&this->text_transformation_flags);
  std::__cxx11::string::operator=((string *)&this->textbody,"");
  this->layer = 0;
  this->scale = 1.0;
  this->angle = 0.0;
  this->xCor = 0;
  this->yCor = 0;
  this->propattr = 0;
  std::__cxx11::string::operator=((string *)&this->propvalue,"");
  return;
}

Assistant:

void gdsTEXT::reset()
{
  presentation_flags.reset();
  text_type = 0;
  path_type = 0;
  width = 0;
  text_transformation_flags.reset();
  textbody = "\0";
  layer = 0;
  scale = 1;
  angle = 0;
  xCor = 0;
  yCor = 0;
  propattr = 0;
  propvalue = "\0";
}